

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O3

address __thiscall
pstore::index::details::internal_node::store_node(internal_node *this,transaction_base *transaction)

{
  uint uVar1;
  size_t size;
  pair<std::shared_ptr<void>,_pstore::address> local_30;
  
  uVar1 = internal_node::size(this);
  size = size_bytes((ulong)uVar1);
  transaction_base::alloc_rw(&local_30,transaction,size,8);
  internal_node((internal_node *)
                local_30.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this);
  if (local_30.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return (address)local_30.second.a_;
}

Assistant:

address internal_node::store_node (transaction_base & transaction) const {
                std::size_t const num_bytes = internal_node::size_bytes (this->size ());

                std::shared_ptr<void> ptr;
                address result;
                std::tie (ptr, result) = transaction.alloc_rw (num_bytes, alignof (internal_node));
                new (ptr.get ()) internal_node (*this);
                return result;
            }